

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_fits.c
# Opt level: O2

char * sfts_read_keystring0(sfts_t *f,char *key)

{
  int iVar1;
  anon_union_8_4_d826882f_for_v aVar2;
  sfkey_t local_40;
  
  local_40.t = '\0';
  local_40._9_7_ = 0;
  local_40.v.f = 0.0;
  local_40.c = (char *)0x0;
  aVar2.f = (double)g_malloc0(0x51);
  local_40.t = 'S';
  local_40.k = key;
  local_40.v.f = aVar2.f;
  iVar1 = sfts_read_keymaybe(f,&local_40);
  if (iVar1 != 1) {
    g_free(aVar2.f);
    aVar2.f = 0.0;
  }
  return (char *)aVar2.f;
}

Assistant:

char *sfts_read_keystring0(sfts_t *f, const char *key) {
    sfkey_t k = {.c = NULL };
    char *ret = (char *) g_malloc0(SKEY_LEN);
    k.k = key, k.t = 'S', k.v.s = ret;
    if (sfts_read_keymaybe(f, &k) != 1) {
        g_free(ret);
        ret = NULL;
    }

    return ret;
}